

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalSubscriptMat4(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  Vector<float,_4> res_5;
  float local_98 [4];
  float local_88 [4];
  float local_78 [4];
  float local_68 [6];
  Vector<float,_4> res_4;
  Vector<float,_4> res_2;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  Vector<float,_4> res_3;
  
  local_78[3] = (c->coords).m_data[0];
  local_78[0] = (c->coords).m_data[1];
  local_78[1] = (c->coords).m_data[2];
  local_78[2] = (c->coords).m_data[3];
  res_4.m_data[2] = 0.0;
  res_4.m_data[3] = 0.0;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_4.m_data[lVar1 + 2] = local_78[lVar1] * 0.5;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_2.m_data[lVar1 + 2] = (c->coords).m_data[lVar1] + res_4.m_data[lVar1 + 2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_88[0] = local_78[1];
  local_88[1] = local_78[2];
  local_88[2] = local_78[3];
  local_88[3] = local_78[0];
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  res_4.m_data[0] = 0.0;
  res_4.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_4.m_data[lVar1 + -2] = local_88[lVar1] * 0.25;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res.m_data[lVar1 + 2] = res_2.m_data[lVar1 + 2] + res_4.m_data[lVar1 + -2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_98[0] = local_78[2];
  local_98[1] = local_78[3];
  local_98[2] = local_78[0];
  local_98[3] = local_78[1];
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  lVar1 = 0;
  do {
    local_68[lVar1] = local_98[lVar1] * 0.125;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1 + 2] = res.m_data[lVar1 + 2] + local_68[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  *(undefined8 *)(c->color).m_data = res_1.m_data._8_8_;
  (c->color).m_data[2] = 0.0;
  (c->color).m_data[3] = 0.0;
  return;
}

Assistant:

void evalSubscriptMat4		(ShaderEvalContext& c) { c.color		= c.coords + 0.5f*c.coords.swizzle(1,2,3,0) + 0.25f*c.coords.swizzle(2,3,0,1) + 0.125f*c.coords.swizzle(3,0,1,2); }